

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-decimal128.c
# Opt level: O0

void test_decimal128_to_string__regular(void)

{
  int iVar1;
  undefined8 local_e8;
  bson_decimal128_t full_house;
  bson_decimal128_t all_digits;
  bson_decimal128_t trailing_zeros;
  bson_decimal128_t largest_regular;
  bson_decimal128_t smallest_regular;
  bson_decimal128_t tenth;
  bson_decimal128_t negative_zero;
  bson_decimal128_t negative_one;
  bson_decimal128_t two;
  bson_decimal128_t zero;
  bson_decimal128_t one;
  char bid_string [43];
  
  one.low = 0x3040000000000000;
  zero.high = 1;
  zero.low = 0x3040000000000000;
  two.high = 0;
  two.low = 0x3040000000000000;
  negative_one.high = 2;
  negative_one.low = 0xb040000000000000;
  negative_zero.high = 1;
  negative_zero.low = 0xb040000000000000;
  tenth.high = 0;
  tenth.low = 0x303e000000000000;
  smallest_regular.high = 1;
  smallest_regular.low = 0x3034000000000000;
  largest_regular.high = 0x4d2;
  largest_regular.low = 0x3040000000000000;
  trailing_zeros.high = 0x1cbe991a14;
  trailing_zeros.low = 0x302a000000000000;
  all_digits.high = 0x75aef40;
  all_digits.low = 0x2ffc3cde6fff9732;
  full_house.high = 0xde825cd07e96aff2;
  full_house.low = 0x3040ffffffffffff;
  local_e8 = 0xffffffffffffffff;
  bson_decimal128_to_string(&zero.high,&one.high);
  iVar1 = strcmp("1",(char *)&one.high);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x8b,"test_decimal128_to_string__regular","!strcmp (\"1\", bid_string)");
    abort();
  }
  bson_decimal128_to_string(&two.high,&one.high);
  iVar1 = strcmp("0",(char *)&one.high);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x8e,"test_decimal128_to_string__regular","!strcmp (\"0\", bid_string)");
    abort();
  }
  bson_decimal128_to_string(&negative_one.high,&one.high);
  iVar1 = strcmp("2",(char *)&one.high);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x91,"test_decimal128_to_string__regular","!strcmp (\"2\", bid_string)");
    abort();
  }
  bson_decimal128_to_string(&negative_zero.high,&one.high);
  iVar1 = strcmp("-1",(char *)&one.high);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x94,"test_decimal128_to_string__regular","!strcmp (\"-1\", bid_string)");
    abort();
  }
  bson_decimal128_to_string(&tenth.high,&one.high);
  iVar1 = strcmp("-0",(char *)&one.high);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x97,"test_decimal128_to_string__regular","!strcmp (\"-0\", bid_string)");
    abort();
  }
  bson_decimal128_to_string(&smallest_regular.high,&one.high);
  iVar1 = strcmp("0.1",(char *)&one.high);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x9a,"test_decimal128_to_string__regular","!strcmp (\"0.1\", bid_string)");
    abort();
  }
  bson_decimal128_to_string(&largest_regular.high,&one.high);
  iVar1 = strcmp("0.001234",(char *)&one.high);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x9d,"test_decimal128_to_string__regular","!strcmp (\"0.001234\", bid_string)");
    abort();
  }
  bson_decimal128_to_string(&trailing_zeros.high,&one.high);
  iVar1 = strcmp("123456789012",(char *)&one.high);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0xa0,"test_decimal128_to_string__regular","!strcmp (\"123456789012\", bid_string)");
    abort();
  }
  bson_decimal128_to_string(&all_digits.high,&one.high);
  iVar1 = strcmp("0.00123400000",(char *)&one.high);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0xa3,"test_decimal128_to_string__regular","!strcmp (\"0.00123400000\", bid_string)");
    abort();
  }
  bson_decimal128_to_string(&full_house.high,&one.high);
  iVar1 = strcmp("0.1234567890123456789012345678901234",(char *)&one.high);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0xa6,"test_decimal128_to_string__regular",
            "!strcmp (\"0.1234567890123456789012345678901234\", bid_string)");
    abort();
  }
  bson_decimal128_to_string(&local_e8,&one.high);
  iVar1 = strcmp("5192296858534827628530496329220095",(char *)&one.high);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0xa9,"test_decimal128_to_string__regular",
            "!strcmp (\"5192296858534827628530496329220095\", bid_string)");
    abort();
  }
  return;
}

Assistant:

static void
test_decimal128_to_string__regular (void)
{
   char bid_string[BSON_DECIMAL128_STRING];
   bson_decimal128_t one;
   bson_decimal128_t zero;
   bson_decimal128_t two;
   bson_decimal128_t negative_one;
   bson_decimal128_t negative_zero;
   bson_decimal128_t tenth;
   bson_decimal128_t smallest_regular;
   bson_decimal128_t largest_regular;
   bson_decimal128_t trailing_zeros;
   bson_decimal128_t all_digits;
   bson_decimal128_t full_house;

   DECIMAL128_FROM_ULLS (one, 0x3040000000000000, 0x0000000000000001);
   DECIMAL128_FROM_ULLS (zero, 0x3040000000000000, 0x0000000000000000);
   DECIMAL128_FROM_ULLS (two, 0x3040000000000000, 0x0000000000000002);
   DECIMAL128_FROM_ULLS (negative_one, 0xb040000000000000, 0x0000000000000001);
   DECIMAL128_FROM_ULLS (negative_zero, 0xb040000000000000, 0x0000000000000000);
   DECIMAL128_FROM_ULLS (
      tenth, 0x303e000000000000, 0x0000000000000001); /* 0.1 */
   /* 0.001234 */
   DECIMAL128_FROM_ULLS (
      smallest_regular, 0x3034000000000000, 0x00000000000004d2);
   /* 12345789012 */
   DECIMAL128_FROM_ULLS (
      largest_regular, 0x3040000000000000, 0x0000001cbe991a14);
   /* 0.00123400000 */
   DECIMAL128_FROM_ULLS (
      trailing_zeros, 0x302a000000000000, 0x00000000075aef40);
   /* 0.1234567890123456789012345678901234 */
   DECIMAL128_FROM_ULLS (all_digits, 0x2ffc3cde6fff9732, 0xde825cd07e96aff2);

   /* 5192296858534827628530496329220095 */
   DECIMAL128_FROM_ULLS (full_house, 0x3040ffffffffffff, 0xffffffffffffffff);

   bson_decimal128_to_string (&one, bid_string);
   BSON_ASSERT (!strcmp ("1", bid_string));

   bson_decimal128_to_string (&zero, bid_string);
   BSON_ASSERT (!strcmp ("0", bid_string));

   bson_decimal128_to_string (&two, bid_string);
   BSON_ASSERT (!strcmp ("2", bid_string));

   bson_decimal128_to_string (&negative_one, bid_string);
   BSON_ASSERT (!strcmp ("-1", bid_string));

   bson_decimal128_to_string (&negative_zero, bid_string);
   BSON_ASSERT (!strcmp ("-0", bid_string));

   bson_decimal128_to_string (&tenth, bid_string);
   BSON_ASSERT (!strcmp ("0.1", bid_string));

   bson_decimal128_to_string (&smallest_regular, bid_string);
   BSON_ASSERT (!strcmp ("0.001234", bid_string));

   bson_decimal128_to_string (&largest_regular, bid_string);
   BSON_ASSERT (!strcmp ("123456789012", bid_string));

   bson_decimal128_to_string (&trailing_zeros, bid_string);
   BSON_ASSERT (!strcmp ("0.00123400000", bid_string));

   bson_decimal128_to_string (&all_digits, bid_string);
   BSON_ASSERT (!strcmp ("0.1234567890123456789012345678901234", bid_string));

   bson_decimal128_to_string (&full_house, bid_string);
   BSON_ASSERT (!strcmp ("5192296858534827628530496329220095", bid_string));
}